

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void rw::decompressDXT1(uint8 *adst,int32 w,int32 h,uint8 *src)

{
  ushort uVar1;
  ushort uVar2;
  uint local_9c;
  uint local_98;
  uint32 k_1;
  uint32 l;
  int32 k;
  uint32 indices;
  uint32 col1;
  uint32 col0;
  int32 j;
  uint8 (*dst) [4];
  uint8 idx [16];
  uint32 c [4] [4];
  int32 y;
  int32 x;
  uint8 *src_local;
  int32 h_local;
  int32 w_local;
  uint8 *adst_local;
  
  c[3][3] = 0;
  c[3][2] = 0;
  for (col1 = 0; (int)col1 < (w * h) / 2; col1 = col1 + 8) {
    uVar1 = *(ushort *)(src + (int)col1);
    uVar2 = *(ushort *)(src + (int)(col1 + 2));
    idx._8_4_ = ((uint)(uVar1 >> 0xb) * 0xff) / 0x1f;
    idx._12_4_ = ((uVar1 >> 5 & 0x3f) * 0xff) / 0x3f;
    c[0][0] = ((uVar1 & 0x1f) * 0xff) / 0x1f;
    c[0][1] = 0xff;
    c[0][2] = ((uint)(uVar2 >> 0xb) * 0xff) / 0x1f;
    c[0][3] = ((uVar2 >> 5 & 0x3f) * 0xff) / 0x3f;
    c[1][0] = ((uVar2 & 0x1f) * 0xff) / 0x1f;
    c[1][1] = 0xff;
    if ((uint)uVar2 < (uint)uVar1) {
      c[1][2] = (idx._8_4_ * 2 + c[0][2]) / 3;
      c[1][3] = (idx._12_4_ * 2 + c[0][3]) / 3;
      c[2][0] = (c[0][0] * 2 + c[1][0]) / 3;
      c[2][1] = 0xff;
      c[2][2] = (idx._8_4_ + c[0][2] * 2) / 3;
      c[2][3] = (idx._12_4_ + c[0][3] * 2) / 3;
      c[3][0] = (c[0][0] + c[1][0] * 2) / 3;
      c[3][1] = 0xff;
    }
    else {
      c[1][2] = idx._8_4_ + c[0][2] >> 1;
      c[1][3] = idx._12_4_ + c[0][3] >> 1;
      c[2][0] = c[0][0] + c[1][0] >> 1;
      c[2][1] = 0xff;
      c[2][2] = 0;
      c[2][3] = 0;
      c[3][0] = 0;
      c[3][1] = 0;
    }
    l = *(uint32 *)(src + (int)(col1 + 4));
    for (k_1 = 0; (int)k_1 < 0x10; k_1 = k_1 + 1) {
      idx[(long)(int)k_1 + -8] = (byte)l & 3;
      l = l >> 2;
    }
    for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
      for (local_9c = 0; local_9c < 4; local_9c = local_9c + 1) {
        adst[(ulong)((c[3][2] + local_98) * w + c[3][3] + local_9c) * 4] =
             (uint8)c[(ulong)idx[(ulong)(local_98 * 4 + local_9c) - 8] - 1][2];
        adst[(ulong)((c[3][2] + local_98) * w + c[3][3] + local_9c) * 4 + 1] =
             (uint8)c[(ulong)idx[(ulong)(local_98 * 4 + local_9c) - 8] - 1][3];
        adst[(ulong)((c[3][2] + local_98) * w + c[3][3] + local_9c) * 4 + 2] =
             (uint8)c[idx[(ulong)(local_98 * 4 + local_9c) - 8]][0];
        adst[(ulong)((c[3][2] + local_98) * w + c[3][3] + local_9c) * 4 + 3] =
             (uint8)c[idx[(ulong)(local_98 * 4 + local_9c) - 8]][1];
      }
    }
    c[3][3] = c[3][3] + 4;
    if (w <= (int)c[3][3]) {
      c[3][2] = c[3][2] + 4;
      c[3][3] = 0;
    }
  }
  return;
}

Assistant:

void
decompressDXT1(uint8 *adst, int32 w, int32 h, uint8 *src)
{
	/* j loops through old texels
	 * x and y loop through new texels */
	int32 x = 0, y = 0;
	uint32 c[4][4];
	uint8 idx[16];
	uint8 (*dst)[4] = (uint8(*)[4])adst;
	for(int32 j = 0; j < w*h/2; j += 8){
		/* calculate colors */
		uint32 col0 = *((uint16*)&src[j+0]);
		uint32 col1 = *((uint16*)&src[j+2]);
		c[0][0] = ((col0>>11) & 0x1F)*0xFF/0x1F;
		c[0][1] = ((col0>> 5) & 0x3F)*0xFF/0x3F;
		c[0][2] = ( col0      & 0x1F)*0xFF/0x1F;
		c[0][3] = 0xFF;

		c[1][0] = ((col1>>11) & 0x1F)*0xFF/0x1F;
		c[1][1] = ((col1>> 5) & 0x3F)*0xFF/0x3F;
		c[1][2] = ( col1      & 0x1F)*0xFF/0x1F;
		c[1][3] = 0xFF;
		if(col0 > col1){
			c[2][0] = (2*c[0][0] + 1*c[1][0])/3;
			c[2][1] = (2*c[0][1] + 1*c[1][1])/3;
			c[2][2] = (2*c[0][2] + 1*c[1][2])/3;
			c[2][3] = 0xFF;

			c[3][0] = (1*c[0][0] + 2*c[1][0])/3;
			c[3][1] = (1*c[0][1] + 2*c[1][1])/3;
			c[3][2] = (1*c[0][2] + 2*c[1][2])/3;
			c[3][3] = 0xFF;
		}else{
			c[2][0] = (c[0][0] + c[1][0])/2;
			c[2][1] = (c[0][1] + c[1][1])/2;
			c[2][2] = (c[0][2] + c[1][2])/2;
			c[2][3] = 0xFF;

			c[3][0] = 0x00;
			c[3][1] = 0x00;
			c[3][2] = 0x00;
			c[3][3] = 0x00;
		}

		/* make index list */
		uint32 indices = *((uint32*)&src[j+4]);
		for(int32 k = 0; k < 16; k++){
			idx[k] = indices & 0x3;
			indices >>= 2;
		}

		/* write bytes */
		for(uint32 l = 0; l < 4; l++)
			for(uint32 k = 0; k < 4; k++){
				dst[(y+l)*w + x+k][0] = c[idx[l*4+k]][0];
				dst[(y+l)*w + x+k][1] = c[idx[l*4+k]][1];
				dst[(y+l)*w + x+k][2] = c[idx[l*4+k]][2];
				dst[(y+l)*w + x+k][3] = c[idx[l*4+k]][3];
			}
		x += 4;
		if(x >= w){
			y += 4;
			x = 0;
		}
	}
}